

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int mainProbeProc(int argc,char **argv,FILE *outf)

{
  atom *theAtoms;
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int *drawSpike_00;
  int local_a1c;
  undefined4 local_9b0;
  int local_9ac;
  movingCommandInfo mcis;
  xformDatabase *xdb;
  FILE *dumpFile;
  residue *resLst;
  movingAtomBuildInfo mabis;
  char message [200];
  int local_818;
  int conFlag;
  int addKinToFile;
  int sayGroup;
  int rawOutput;
  int countDots;
  int drawSpike;
  float spikelen;
  float probeRad;
  float density;
  pattern *ignorePat;
  pattern *targPat;
  pattern *srcPat;
  char *groupLabel;
  char *ignoreArg;
  char *extraArg;
  char *targArg;
  char *srcArg;
  pointSet dots [114];
  atomBins *abins;
  atom *allMainAtoms;
  atom *a;
  region boundingBoxA;
  int keepUnselected;
  int method;
  FILE *outf_local;
  char **argv_local;
  int argc_local;
  
  dots[0x71].p = (point3d *)0x0;
  targArg = (char *)0x0;
  extraArg = (char *)0x0;
  ignoreArg = (char *)0x0;
  groupLabel = (char *)0x0;
  srcPat = (pattern *)0x0;
  targPat = (pattern *)0x0;
  ignorePat = (pattern *)0x0;
  _probeRad = (pattern *)0x0;
  dumpFile = (FILE *)0x0;
  drawSpike_00 = &rawOutput;
  theAtoms = processCommandline(argc,argv,(int *)((long)&boundingBoxA.max.z + 4),(region *)&a,
                                &spikelen,(float *)&drawSpike,drawSpike_00,(float *)&countDots,
                                &sayGroup,(int *)&boundingBoxA.max.z,&targArg,&extraArg,&ignoreArg,
                                &groupLabel,(char **)&srcPat,&addKinToFile,(int *)(message + 0xc4),
                                &conFlag,&local_818,(movingAtomBuildInfo *)&resLst,
                                (residue **)&dumpFile);
  if ((theAtoms == (atom *)0x0) && (mabis._0_8_ == 0)) {
    sprintf((char *)&mabis.scratchRes,"No atom data in input.");
    note((char *)&mabis.scratchRes);
  }
  else {
    if (Verbose != 0) {
      note(versionString);
      sprintf((char *)&mabis.scratchRes,"density: %g, probe radius: %g, maxBonded: %d",
              (double)spikelen,(double)(float)drawSpike,(ulong)(uint)Maxbonded);
      note((char *)&mabis.scratchRes);
      sprintf((char *)&mabis.scratchRes,"regular HB cutoff: %g, charged HB cutoff: %g",
              (double)Min_regular_hb_cutoff,(double)Min_charged_hb_cutoff);
      note((char *)&mabis.scratchRes);
      sprintf((char *)&mabis.scratchRes,
              "Dot gap bins: low to %g, %g to 0, 0 to %g, %g to high, & Hbonds",(double)LowGoodCut,
              (double)LowGoodCut,(double)HighGoodCut);
      note((char *)&mabis.scratchRes);
      if ((RadScaleOffset < -0.0001) || (0.0001 < RadScaleOffset)) {
        sprintf((char *)&mabis.scratchRes,"Add %g to VDW Rradius",(double)RadScaleOffset);
        note((char *)&mabis.scratchRes);
      }
      if ((RadScaleFactor < 0.9999) || (1.0001 < RadScaleFactor)) {
        sprintf((char *)&mabis.scratchRes,"Scale VDW Rradius by %g",(double)RadScaleFactor);
        note((char *)&mabis.scratchRes);
      }
      sprintf((char *)&mabis.scratchRes,"C=O carbon VDW scaled by %.3f to a radius of %g A",
              (double)CORadScale,(double)CORadScale * 1.7);
      note((char *)&mabis.scratchRes);
      if ((addKinToFile != 0) || (sayGroup != 0)) {
        sprintf((char *)&mabis.scratchRes,"Score Weights: gapWt=%g, bumpWt=%g, HBWt=%g",
                (double)GAPweight,(double)BUMPweight,(double)HBweight);
        note((char *)&mabis.scratchRes);
      }
      if (rawOutput != 0) {
        sprintf((char *)&mabis.scratchRes,"draw spike, len: %g",(double)(float)countDots);
        note((char *)&mabis.scratchRes);
      }
      if (ImplicitH != 0) {
        note("implicit hydrogens");
      }
      if (PermitCHXHB != 0) {
        sprintf((char *)&mabis.scratchRes,"CH..O type hbonds recognized (scale factor %g)",
                (double)CHOHBfactor);
        note((char *)&mabis.scratchRes);
      }
      if (DoMcMc == 0) {
        note("Excluding mainchain-mainchain interactions");
      }
      if ((DoHet == 0) && (DoH2O == 0)) {
        note("Excluding both HET groups and waters");
      }
      else {
        if (DoHet == 0) {
          note("Excluding non-water HET groups");
        }
        if (DoH2O == 0) {
          note("Excluding waters");
        }
        else if (DoWatWat == 0) {
          note("Excluding water-water interactions");
        }
      }
      if (LimitDots != 0) {
        note("Limiting dots from bumps to max non-bump cap");
      }
      if (addKinToFile == 0) {
        if (OutputFmtType == 1) {
          note("Formatting for display in O");
        }
        else if (OutputFmtType == 2) {
          note("Formatting for display in XtalView");
        }
        else if (OutputFmtType == 3) {
          note("outputing one line colon:deliminated:counts:by:severity:type:");
        }
      }
      if (ByNABaseColor == 0) {
        if (ColorGap != 0) {
          note("Coloring dots by gap (& list color by atom)");
        }
      }
      else if (ColorGap == 0) {
        note("Coloring dots by nucleic acid base");
      }
      else {
        note("Coloring dots by gap (& list color by nucleic acid base)");
      }
      if (UsePolarH == 0) {
        note("Using old (long) radii for polar H atoms");
      }
      if (OutputHBs == 0) {
        note("Attention: ***Output not generated for H-Bond contacts***");
      }
      if (OutputClashes == 0) {
        note("Attention: ***Output not generated for clashes***");
      }
      if (OutputVDWs == 0) {
        note("Attention: ***Output not generated for van der Waals contacts***");
      }
      if (OnlyBadOut != 0) {
        note("Attention: ***Output only generated for Bad Clashes***");
      }
      if (boundingBoxA.max.z._0_4_ == 0) {
        note("Attention: ***Unselected atoms dropped (ignored)***");
      }
    }
    if ((((local_818 != 0) && (OutputFmtType == 0)) && (sayGroup == 0)) && (addKinToFile == 0)) {
      fprintf((FILE *)outf,"@kinemage 1\n");
    }
    targPat = getPat(targArg,"pattern 1",Verbose);
    sourcePat = getPat(targArg,"pattern 1",Verbose);
    modelSrc = modelInPattern(targPat);
    if ((Verbose != 0) && (0 < modelSrc)) {
      sprintf((char *)&mabis.scratchRes,"specified src  model==%d",(ulong)(uint)modelSrc);
      note((char *)&mabis.scratchRes);
    }
    ignorePat = getPat(extraArg,"pattern 2",Verbose);
    causePat = getPat(extraArg,"pattern 2",Verbose);
    modelTarg = modelInPattern(ignorePat);
    if ((Verbose != 0) && (0 < modelSrc)) {
      sprintf((char *)&mabis.scratchRes,"specified targ model==%d",(ulong)(uint)modelTarg);
      note((char *)&mabis.scratchRes);
    }
    extraPat = getPat(ignoreArg,"extra",Verbose);
    _probeRad = getPat(groupLabel,"ignore",Verbose);
    loadDotSpheres((pointSet *)&srcArg,spikelen);
    if (theAtoms == (atom *)0x0) {
      boundingBoxA.min.y = 0.0;
      boundingBoxA.min.x = 0.0;
      a = (atom *)0x0;
      boundingBoxA.max.y = 0.1;
      boundingBoxA.max.x = 0.1;
      boundingBoxA.min.z = 0.1;
      dots[0x71].p = &initBins('a',(region *)&a,1.0)->min;
    }
    else {
      selectSource(theAtoms,targPat,1,ignorePat,2,_probeRad);
      dots[0x71].p = &binAtoms(theAtoms,(region *)&a,'a',(float)drawSpike,boundingBoxA.max.z._0_4_,3
                              )->min;
    }
    if (mabis._0_8_ == 0) {
      if (ImplicitH == 0) {
        drawSpike_00 = (int *)((ulong)drawSpike_00 & 0xffffffff00000000);
        updateHydrogenInfo(outf,theAtoms,(atomBins *)dots[0x71].p,(atom *)0x0,(atomBins *)0x0,3,0);
      }
      if (dumpFileName != (char *)0x0) {
        __stream = fopen(dumpFileName,"wb");
        for (allMainAtoms = theAtoms; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next
            ) {
          if (allMainAtoms->elem != 5) {
            if (allMainAtoms->altConf == ' ') {
              local_a1c = 0x2d;
            }
            else {
              local_a1c = (int)allMainAtoms->altConf;
            }
            pcVar3 = "noAcceptor";
            if ((allMainAtoms->props & 0x20000U) != 0) {
              pcVar3 = "isAcceptor";
            }
            pcVar2 = "noDonor";
            if ((allMainAtoms->props & 0x10000U) != 0) {
              pcVar2 = "isDonor";
            }
            pcVar1 = "noMetallic";
            if ((allMainAtoms->props & 0x4000U) != 0) {
              pcVar1 = "isMetallic";
            }
            drawSpike_00 = (int *)CONCAT44((int)((ulong)drawSpike_00 >> 0x20),local_a1c);
            fprintf(__stream,"%s %s %3d %-4s %c %7.3f %7.3f %7.3f %5.2f %s %s %s\n",
                    (allMainAtoms->loc).x,(allMainAtoms->loc).y,(allMainAtoms->loc).z,
                    allMainAtoms->r->chain,allMainAtoms->r->resname,
                    (ulong)(uint)allMainAtoms->r->resid,allMainAtoms->atomname,drawSpike_00,pcVar3,
                    pcVar2,pcVar1);
          }
        }
        fclose(__stream);
      }
      doCommand(outf,boundingBoxA.max.z._4_4_,theAtoms,(atomBins *)dots[0x71].p,(atom *)0x0,
                (atomBins *)0x0,(pointSet *)&srcArg,(float)drawSpike,spikelen,(float)countDots,
                sayGroup,addKinToFile,message._196_4_,"",0.0,rawOutput,conFlag,(char *)srcPat,argc,
                argv,(char *)&mabis.scratchRes);
    }
    else {
      mcis.message = (char *)0x0;
      local_9b0 = 1;
      local_9ac = boundingBoxA.max.z._0_4_;
      mcis.outf._0_4_ = boundingBoxA.max.z._4_4_;
      mcis.allMainAtoms = (atom *)0x0;
      mcis.waterClones = (atom *)dots[0x71].p;
      mcis.abins = (atomBins *)&srcArg;
      mcis.dots._0_4_ = drawSpike;
      mcis.dots._4_4_ = spikelen;
      mcis.probeRad = (float)countDots;
      mcis.density = (float)sayGroup;
      mcis.spikelen = (float)addKinToFile;
      mcis.countDots = rawOutput;
      mcis.rawOutput = conFlag;
      mcis._80_8_ = srcPat;
      mcis.argv = (char **)&mabis.scratchRes;
      mabis._16_8_ = targPat;
      mabis.srcPat = ignorePat;
      mcis._0_8_ = outf;
      mcis._16_8_ = theAtoms;
      mcis.groupLabel._0_4_ = argc;
      mcis._96_8_ = argv;
      descrCommand(outf,"#","#",argc,argv);
      mcis.message = (char *)readTransformationDatabase
                                       ((FILE *)mabis._0_8_,outf,newMovingAtom,&resLst,
                                        movingAtomListProcessing,(void *)0x0,"#");
      if ((int)mabis.inf != 0) {
        fclose((FILE *)mabis._0_8_);
      }
      autobondrot(_stderr,(xformDatabase *)mcis.message,movingDoCommand,&local_9b0,deleteMovingAtom,
                  &resLst,Verbose);
      discardXformDB((xformDatabase *)mcis.message,deleteMovingAtom,&resLst);
    }
    disposeBins((atomBins *)dots[0x71].p);
    dots[0x71].p = (point3d *)0x0;
    freeDotSphere(&COdots);
    unloadDotSpheres((pointSet *)&srcArg);
    freePattern(_probeRad);
    _probeRad = (pattern *)0x0;
    freePattern(ignorePat);
    ignorePat = (pattern *)0x0;
    freePattern(targPat);
    targPat = (pattern *)0x0;
    freePattern(sourcePat);
    sourcePat = (pattern *)0x0;
    freePattern(causePat);
    causePat = (pattern *)0x0;
    freePattern(extraPat);
    extraPat = (pattern *)0x0;
    if (Verbose != 0) {
      note("If you publish work which uses probe, please cite:");
      note(referenceString);
      sprintf((char *)&mabis.scratchRes,"For more information see %s",electronicReference);
      note((char *)&mabis.scratchRes);
    }
  }
  disposeListOfResidues((residue *)dumpFile);
  dumpFile = (FILE *)0x0;
  disposeListOfAtoms(theAtoms);
  return 0;
}

Assistant:

int mainProbeProc(int argc, char **argv, FILE *outf)
{/*mainProbeProc()*/
   int method;
   int keepUnselected;
   region boundingBoxA;
   atom *a, *allMainAtoms = NULL;
   atomBins *abins = NULL;
   pointSet dots[NUMATOMTYPES];
   char *srcArg=NULL, *targArg=NULL, *extraArg=NULL, *ignoreArg=NULL; /* extraArg dcr 111022*/
   char *groupLabel=NULL;
   pattern *srcPat = NULL, *targPat = NULL, *ignorePat = NULL;
   float density, probeRad, spikelen;
   int drawSpike, countDots, rawOutput, sayGroup, addKinToFile, conFlag; //conFlag by SJ - 10/07/2011
   char message[200];
   movingAtomBuildInfo mabis;
   residue *resLst = NULL;
   FILE* dumpFile = NULL;

   /*mabis moving atom build info structure */
   /*buffer to pass data to newMovingAtom for autobondrot*/

   allMainAtoms = processCommandline(argc, argv, &method,
        &boundingBoxA, &density, &probeRad,
        &drawSpike, &spikelen, &countDots, &keepUnselected,
        &srcArg, &targArg, &extraArg, &ignoreArg, &groupLabel, &rawOutput, &conFlag,
        &sayGroup, &addKinToFile, &mabis, &resLst);//conFlag by SJ -10/07/2011

        /*called with address of mabis, i.e. mabip moving atom build info ptr */
        /*autobondrot mode: not read in any mobile atoms yet*/
        /*though may have static set of atoms already in. */

/* dumpRes(resLst); */

   if ((allMainAtoms == NULL) && (mabis.inf == NULL))
   {
      /*static atoms read into allMainAtoms linked list, */
      /* and/or autobondrot file name for mobile atoms held in mabis.inf */

      sprintf(message, "No atom data in input.");
      note(message);
   }
   else
   {/*there are atoms for probe to work on...*/
      if (Verbose)
      {/*Verbose: lots of stuff to screen...*/

	 note(versionString);
	 sprintf(message, "density: %g, probe radius: %g, maxBonded: %d",
			density, probeRad, Maxbonded);
	 note(message);
	 sprintf(message, "regular HB cutoff: %g, charged HB cutoff: %g",
			Min_regular_hb_cutoff, Min_charged_hb_cutoff);
	 note(message);
	 sprintf(message,
	 "Dot gap bins: low to %g, %g to 0, 0 to %g, %g to high, & Hbonds",
			LowGoodCut, LowGoodCut, HighGoodCut, HighGoodCut);
	 note(message);
	 if (RadScaleOffset < -0.0001 || RadScaleOffset > 0.0001) {
	    sprintf(message, "Add %g to VDW Rradius",
			RadScaleOffset);
	    note(message);
	 }
	 if (RadScaleFactor < 0.9999 || RadScaleFactor > 1.0001) {
	    sprintf(message, "Scale VDW Rradius by %g",
			RadScaleFactor);
	    note(message);
	 }
	 sprintf(message, "C=O carbon VDW scaled by %.3f to a radius of %g A",
			   CORadScale, CORadScale* ATOMC_EXPLICIT_VDW);
	 note(message);
	 if (rawOutput || countDots) {
	    sprintf(message, "Score Weights: gapWt=%g, bumpWt=%g, HBWt=%g",
			GAPweight, BUMPweight, HBweight);
	    note(message);
     }
	 if (drawSpike) {
	    sprintf(message, "draw spike, len: %g", spikelen);
	    note(message);
	 }
	 if (ImplicitH) {
	    note("implicit hydrogens");
	 }
	 if (PermitCHXHB) {
	    sprintf(message, "CH..O type hbonds recognized (scale factor %g)", CHOHBfactor);
	    note(message);
	 }
	 if (!DoMcMc) {
	    note("Excluding mainchain-mainchain interactions");
	 }

	 if (!DoHet && !DoH2O) {
	    note("Excluding both HET groups and waters");
	 }
	 else {
	    if (!DoHet) {
	       note("Excluding non-water HET groups");
	    }
	    if (!DoH2O) {
	       note("Excluding waters");
	    }
	    else if (!DoWatWat) {
	       note("Excluding water-water interactions");
	    }
	 }
	 if (LimitDots) {
	    note("Limiting dots from bumps to max non-bump cap");
	 }

	 if (rawOutput) { /* nothing required for raw format */
	 }
	 else if (OutputFmtType == 1) {
	    note("Formatting for display in O");
	 }
	 else if (OutputFmtType == 2) {
	    note("Formatting for display in XtalView");
	 }
	 else if (OutputFmtType == 3) { /*dcr041101*/
	    note("outputing one line colon:deliminated:counts:by:severity:type:");
	 }

	 if (ByNABaseColor) {
	    if (ColorGap) {
	       note("Coloring dots by gap (& list color by nucleic acid base)");
	    }
	    else {
	       note("Coloring dots by nucleic acid base");
	    }
	 }
	 else if (ColorGap) {
	    note("Coloring dots by gap (& list color by atom)");
	 }
	 if (!UsePolarH) {
	    note("Using old (long) radii for polar H atoms");
	 }
	 if (!OutputHBs) {
	    note("Attention: ***Output not generated for H-Bond contacts***");
	 }
	 if (!OutputClashes) {
	    note("Attention: ***Output not generated for clashes***");
	 }
	 if (!OutputVDWs) {
	    note("Attention: ***Output not generated for van der Waals contacts***");
	 }
	 if (OnlyBadOut) {
	    note("Attention: ***Output only generated for Bad Clashes***");/*dcr041010*/
     }
	 if (!keepUnselected) {
	    note("Attention: ***Unselected atoms dropped (ignored)***");
	 }
    }/*Verbose: lots of stuff to screen...*/

    /*now do some work...*/
    if(   addKinToFile  && (OutputFmtType == 0)
       && (! countDots) && (! rawOutput) ) {
       fprintf(outf, "@kinemage 1\n");
    }

    srcPat = getPat(srcArg,   "pattern 1", Verbose);
    sourcePat = getPat(srcArg,   "pattern 1", Verbose);/*111021dcr*/
    modelSrc = modelInPattern(srcPat); /*parse.c 041114*/
    if(Verbose && modelSrc > 0)
    {
       sprintf(message, "specified src  model==%d", modelSrc);
       note(message);
    }
    targPat = getPat(targArg,  "pattern 2", Verbose);
    causePat = getPat(targArg,  "pattern 2", Verbose); /*111021dcr nearest*/
    modelTarg = modelInPattern(targPat); /*parse.c 041114*/
    if(Verbose && modelSrc > 0)
    {
       sprintf(message, "specified targ model==%d", modelTarg);
       note(message);
    }
    extraPat = getPat(extraArg,"extra", Verbose); /*111023dcr*/
    ignorePat = getPat(ignoreArg,"ignore",    Verbose);

    loadDotSpheres(dots, density);

      if (allMainAtoms) /*atoms usually read in from processCommandline()*/
      {  /*build the bins for all static atoms*/
         selectSource(allMainAtoms, srcPat, SET1, targPat, SET2, ignorePat);
         abins = binAtoms(allMainAtoms, &boundingBoxA,
                          'a', probeRad, keepUnselected, SET1|SET2);
      }
      else /*but autobondrot mode may not yet have read in any atoms*/
      {/*minimal boundingBoxes setup*/
         boundingBoxA.min.x = boundingBoxA.min.y = boundingBoxA.min.z = 0.0;
         boundingBoxA.max.x = boundingBoxA.max.y = boundingBoxA.max.z = 0.1;
         abins = initBins('a', &boundingBoxA, 1); /* dummy bbox */
      }

      if (mabis.inf == NULL) /*pseudo modal flag for autobondrot*/
      {/*there is NOT an autobondrot atom info input file */
         if (! ImplicitH)
         { /*preliminary step acts on all atoms*/
            updateHydrogenInfo(outf, allMainAtoms, abins,
                               NULL, NULL, SET1|SET2, FALSE);
            /*(returned param used on separate call for autobondrot processing)*/
            /*e.g. creates: newH->elem = atomHOd , dummy Hydrogen to make an H-Bond*/
         }

    /* Dump the atom information if we've been asked to. */
    if (dumpFileName) {
      dumpFile = fopen(dumpFileName, "wb");
      for (a = allMainAtoms; a; a = a->next) {
        /* Don't dump Phantom Hydrogen information. */
        if (a->elem != atomHOd) {
          fprintf(dumpFile, "%s %s %3d %-4s %c %7.3f %7.3f %7.3f %5.2f %s %s %s\n",
            a->r->chain, a->r->resname, a->r->resid, a->atomname,
            a->altConf == ' ' ? '-' : a->altConf,
            a->loc.x, a->loc.y, a->loc.z, a->radius,
            a->props & ACCEPTOR_PROP ? "isAcceptor" : "noAcceptor",
            a->props & DONOR_PROP ? "isDonor" : "noDonor",
            a->props & METAL_PROP ? "isMetallic" : "noMetallic");
        }
      }
      fclose(dumpFile);
    }

   /*now do the real work: */
	 doCommand(outf, method,
	    allMainAtoms, abins, NULL, NULL,
	    dots, probeRad, density, spikelen,
	    countDots, rawOutput, conFlag, "", 0.0, drawSpike,
	    sayGroup, groupLabel, argc, argv, message);
      }
      else
      {/*setup to call autobondrot*/
	 xformDatabase* xdb = NULL;
	 movingCommandInfo mcis;

	 mcis.firstPass  = TRUE;
	 mcis.keepUnselected = keepUnselected;
	 mcis.outf       = outf;
	 mcis.method     = method;
	 mcis.allMainAtoms = allMainAtoms;
	 mcis.waterClones= NULL;
	 mcis.abins      = abins;
	 mcis.dots       = dots;
	 mcis.probeRad   = probeRad;
	 mcis.density    = density;
	 mcis.spikelen   = spikelen;
	 mcis.countDots  = countDots;
	 mcis.rawOutput  = rawOutput;
	 mcis.drawSpike  = drawSpike;
	 mcis.sayGroup   = sayGroup;
	 mcis.groupLabel = groupLabel;
	 mcis.argc       = argc;
	 mcis.argv       = argv;
	 mcis.message    = message;

	 mabis.srcPat    = srcPat;
	 mabis.targPat   = targPat;

#define RAW_HEADER_COMMENT "#"

        descrCommand(outf, RAW_HEADER_COMMENT, RAW_HEADER_COMMENT, argc, argv);

        /*now actually read in both the mobile atoms and transformation info*/

	xdb = readTransformationDatabase(mabis.inf, outf, newMovingAtom, &mabis,
                                       movingAtomListProcessing, NULL,
                                       RAW_HEADER_COMMENT);

/*        mabis.inf                == FILE *inf                      */
/*        outf                     == FILE *outf                     */
/*        newMovingAtom            == abrMkAtomProc mkAtom           */
/*        &mabis                   == void *atomstuff                */
/*        movingAtomListProcessing == abrAtomListProc inputListProc  */
/*        NULL                     == void *liststuff                */
/*        RAW_HEADER_COMMENT       == char *cch                      */

         /*autobondrot/readTransformationDatabase()             */
         /* also calls autobondrot/describeXformDB()            */
         /*  which writes the header-comments to the .map file! */

	 if (mabis.close) { fclose(mabis.inf); }

	 autobondrot(stderr, xdb, movingDoCommand, &mcis,
		  deleteMovingAtom, &mabis, Verbose);

         /*autobondrot.c/autobondrot() is the call to do the autobondrot stuff*/
         /*movingDoCommand is the name of the probeProc() called from there */
         /*probe.c/movingDoCommand() in turn calls probe.c/doCommand()*/

	 discardXformDB(xdb, deleteMovingAtom, &mabis);
      }/*setup to call autobondrot*/

      /*after finish, then drop through to here to release memory, etc.*/

      disposeBins(abins);         abins = NULL;
      freeDotSphere(&COdots);
      unloadDotSpheres(dots);
      freePattern(ignorePat); ignorePat = NULL;
      freePattern(targPat);     targPat = NULL;
      freePattern(srcPat);       srcPat = NULL;
      freePattern(sourcePat); sourcePat = NULL; /*111023dcr*/
      freePattern(causePat);   causePat = NULL; /*111023dcr*/
      freePattern(extraPat);   extraPat = NULL; /*111023dcr*/

      if (Verbose)
      {
	 note("If you publish work which uses probe, please cite:");
	 note(referenceString);
	 sprintf(message, "For more information see %s", electronicReference);
	 note(message);
      }
   }/*there are atoms for probe to work on...*/

   disposeListOfResidues(resLst);          resLst = NULL;
   disposeListOfAtoms(allMainAtoms); allMainAtoms = NULL;

   return 0; /*to probe.c/main() */
}